

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O3

void __thiscall KDIS::KException::KException(KException *this,KString *Text,KUINT16 EC)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  ulong uVar6;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long local_70;
  char *local_68;
  long local_60;
  undefined5 local_58;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined4 uStack_51;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 local_4a;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  *(undefined ***)this = &PTR__KException_00220b98;
  this->m_ui16ErrorCode = EC;
  pcVar3 = (Text->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + Text->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  local_68 = (char *)&local_58;
  switch(EC) {
  case 0:
    local_58 = 0x7245206f4e;
    uStack_53 = 0x72;
    uStack_52 = 0x6f;
    uStack_51 = 0x202e7372;
    local_60 = 0xb;
    uStack_4d = 0;
    goto LAB_001266de;
  case 1:
    local_70 = 0x15;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Buffer Is Too Sm",0x10);
    uVar5 = 0x202e6c6c616d5320;
    goto LAB_001265b5;
  case 2:
    local_70 = 0x36;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Buffer Does Not Contain Enough Information To Decode. ",0x36);
    break;
  case 3:
    local_70 = 0x15;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"String Size Too ",0x10);
    uVar5 = 0x202e676942206f6f;
LAB_001265b5:
    *(undefined8 *)(local_68 + 0xd) = uVar5;
    break;
  case 4:
    local_70 = 0x18;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Data Type Is Too Large. ",0x18);
    break;
  case 5:
    local_70 = 0x28;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Incorrect PDU Type Specified In Header. ",0x28);
    break;
  case 6:
    local_70 = 0x29;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Could Not Open File For Reading/Writing. ",0x29);
    break;
  case 7:
    local_70 = 0x37;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Parameter Is Out Of Bounds/Range Of Acceptable Values. ",0x37);
    break;
  case 8:
    uStack_4d = 0x61;
    uStack_4c = 0x2e;
    uStack_4b = 0x20;
    local_58 = 0x6c61766e49;
    uStack_53 = 0x69;
    uStack_52 = 100;
    uStack_51 = 0x74614420;
    local_60 = 0xe;
    local_4a = 0;
    goto LAB_001266de;
  case 9:
    local_70 = 0x27;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Unsupported Data Type, Can Not Decode. ",0x27);
    break;
  case 10:
    local_70 = 0x13;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Invalid Operation. ",0x13);
    break;
  case 0xb:
    local_70 = 0x31;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",0x31);
    break;
  case 0xc:
    uStack_4d = 0x72;
    uStack_4c = 0x2e;
    local_58 = 0x656b636f53;
    uStack_53 = 0x74;
    uStack_52 = 0x20;
    uStack_51 = 0x6f727265;
    local_60 = 0xd;
    uStack_4b = 0;
    goto LAB_001266de;
  default:
    local_70 = 0x14;
    local_68 = (char *)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_70);
    local_58 = (undefined5)local_70;
    uStack_53 = (undefined1)((ulong)local_70 >> 0x28);
    uStack_52 = (undefined1)((ulong)local_70 >> 0x30);
    uStack_51._0_1_ = (undefined1)((ulong)local_70 >> 0x38);
    builtin_strncpy(local_68,"Unknown KDIS Error. ",0x14);
  }
  local_68[local_70] = '\0';
  local_60 = local_70;
LAB_001266de:
  uVar6 = 0xf;
  if (local_48 != local_38) {
    uVar6 = local_38[0];
  }
  if (uVar6 < (ulong)(local_60 + local_40)) {
    uVar6 = 0xf;
    if (local_68 != (char *)&local_58) {
      uVar6 = CONCAT17((undefined1)uStack_51,CONCAT16(uStack_52,CONCAT15(uStack_53,local_58)));
    }
    if ((ulong)(local_60 + local_40) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_00126738;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_00126738:
  paVar1 = &(this->m_sErrorText).field_2;
  (this->m_sErrorText)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar5 = puVar4[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->m_sErrorText).field_2 + 8) = uVar5;
  }
  else {
    (this->m_sErrorText)._M_dataplus._M_p = (pointer)*puVar4;
    (this->m_sErrorText).field_2._M_allocated_capacity = *psVar2;
  }
  (this->m_sErrorText)._M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_68 != (char *)&local_58) {
    operator_delete(local_68,CONCAT17((undefined1)uStack_51,
                                      CONCAT16(uStack_52,CONCAT15(uStack_53,local_58))) + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC) :
        m_ui16ErrorCode( EC ),
        m_sErrorText( Text + ": " + GetErrorText( EC ) )
    {
    }